

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macro.c
# Opt level: O1

int macro_sim_dst(char *out,uint32_t c,uint32_t res,macro_interpreter_state *istate)

{
  obj *obj;
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  uint uVar5;
  uint uVar6;
  undefined4 in_register_00000014;
  macro_interpreter_state *istate_00;
  uint data;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  
  istate_00 = (macro_interpreter_state *)CONCAT44(in_register_00000014,res);
  uVar9 = (ulong)c;
  uVar8 = (uint)out;
  uVar5 = uVar8 & 0x70;
  if (uVar5 == 0x10) {
    uVar7 = (ulong)(uVar8 >> 8 & 7);
    sprintf(reg1_str::r,"%s$r%d%s",colors->reg,uVar7,colors->reset);
    sprintf(outs,"%s := %s0x%x%s",reg1_str::r,colors->num,uVar9,colors->reset);
LAB_0024f16b:
    istate_00->regs[uVar7] = c;
    return 0;
  }
  if (((ulong)out & 0x70) == 0) {
    if (istate_00->macro_param == (uint32_t *)0x0) {
      return 1;
    }
    uVar7 = (ulong)((uint)((ulong)out >> 8) & 7);
    sprintf(reg1_str::r,"%s$r%d%s",colors->reg,uVar7,colors->reset);
    sprintf(outs,"%s := %s0x%x%s",reg1_str::r,colors->num,(ulong)*istate_00->macro_param,
            colors->reset);
  }
  else {
    obj = istate_00->obj;
    uVar6 = uVar8 & 0x770;
    if (uVar6 == 0x20) {
      uVar5 = c * 4 & 0x3ffc;
      istate_00->mthd = uVar5;
      istate_00->incr = c >> 0xc & 0x3f;
      decode_method_raw(uVar5,0,obj,dec_obj,dec_mthd,(char *)0x0);
      sprintf(outs,"%s := %s0x%x%s [%s.%s], %s := %s%d%s",mcr_mthd,colors->num,
              (ulong)istate_00->mthd,colors->reset,dec_obj,dec_mthd,mcr_incr,colors->num,
              (ulong)istate_00->incr,colors->reset);
      return 0;
    }
    if (uVar5 != 0x30) {
      if (uVar5 == 0x20) {
        uVar5 = c * 4 & 0x3ffc;
        istate_00->mthd = uVar5;
        istate_00->incr = c >> 0xc & 0x3f;
        decode_method_raw(uVar5,0,obj,dec_obj,dec_mthd,(char *)0x0);
        uVar7 = (ulong)(uVar8 >> 8 & 7);
        sprintf(reg1_str::r,"%s$r%d%s",colors->reg,uVar7,colors->reset);
        sprintf(outs,"%s := %s := %s0x%x%s [%s.%s], %s := %s%d%s",reg1_str::r,mcr_mthd,colors->num,
                (ulong)istate_00->mthd,colors->reset,dec_obj,dec_mthd,mcr_incr,colors->num,
                (ulong)istate_00->incr,colors->reset);
        goto LAB_0024f16b;
      }
      if (uVar6 == 0x40) {
        decode_method_raw(istate_00->mthd,c,obj,dec_obj,dec_mthd,dec_val);
        register_method_call(istate_00,c);
        sprintf(outs,"%s.%s := %s0x%x%s [%s]",dec_obj,dec_mthd,colors->num,uVar9,colors->reset,
                dec_val);
LAB_0024f43e:
        istate_00->mthd = istate_00->mthd + istate_00->incr * 4;
        return 0;
      }
      if (uVar5 == 0x50) {
        if (istate_00->macro_param == (uint32_t *)0x0) {
          return 1;
        }
        uVar5 = c * 4 & 0x3ffc;
        istate_00->mthd = uVar5;
        istate_00->incr = c >> 0xc & 0x3f;
        decode_method_raw(uVar5,0,obj,dec_obj,dec_mthd,(char *)0x0);
        pcVar4 = mcr_incr;
        pcVar3 = mcr_mthd;
        pcVar1 = colors->reset;
        pcVar2 = colors->num;
        uVar5 = istate_00->mthd;
        uVar6 = istate_00->incr;
        reg1_str(uVar8);
        sprintf(outs,"%s := %s0x%x%s [%s.%s], %s := %s%d%s, %s := %s0x%x%s",pcVar3,pcVar2,
                (ulong)uVar5,pcVar1,dec_obj,dec_mthd,pcVar4,pcVar2,(ulong)uVar6,pcVar1,reg1_str::r,
                colors->num,(ulong)*istate_00->macro_param,colors->reset);
        *(uint32_t *)((long)istate_00->regs + (ulong)(uVar8 >> 6 & 0x1c)) = *istate_00->macro_param;
      }
      else {
        if (uVar5 == 0x40) {
          decode_method_raw(istate_00->mthd,c,obj,dec_obj,dec_mthd,dec_val);
          register_method_call(istate_00,c);
          pcVar1 = colors->reset;
          pcVar2 = colors->num;
          reg1_str(uVar8);
          sprintf(outs,"%s.%s := %s0x%x%s [%s], %s := %s0x%x%s",dec_obj,dec_mthd,pcVar2,uVar9,pcVar1
                  ,dec_val,reg1_str::r,colors->num,uVar9,colors->reset);
          istate_00->mthd = istate_00->mthd + istate_00->incr * 4;
          *(uint32_t *)((long)istate_00->regs + (ulong)(uVar8 >> 6 & 0x1c)) = c;
          return 0;
        }
        if (uVar6 == 0x60) {
          if (istate_00->macro_param == (uint32_t *)0x0) {
            return 1;
          }
          uVar5 = c * 4 & 0x3ffc;
          istate_00->mthd = uVar5;
          istate_00->incr = c >> 0xc & 0x3f;
          decode_method_raw(uVar5,*istate_00->macro_param,obj,dec_obj,dec_mthd,dec_val);
          register_method_call(istate_00,*istate_00->macro_param);
          pcVar1 = colors->reset;
          pcVar2 = colors->num;
          sprintf(outs,"%s := %s0x%x%s [%s.%s], %s := %s%d%s, %s.%s := %s0x%x%s [%s]",mcr_mthd,
                  pcVar2,(ulong)istate_00->mthd,pcVar1,dec_obj,dec_mthd,mcr_incr,pcVar2,
                  (ulong)istate_00->incr,pcVar1,dec_obj,dec_mthd,pcVar2,
                  (ulong)*istate_00->macro_param,pcVar1,dec_val);
          istate_00->mthd = istate_00->mthd + istate_00->incr * 4;
        }
        else {
          if (uVar5 != 0x60) {
            if (uVar6 == 0x70) {
              uVar5 = c * 4 & 0x3ffc;
              istate_00->mthd = uVar5;
              uVar8 = c >> 0xc & 0x3f;
              decode_method_raw(uVar5,uVar8,obj,dec_obj,dec_mthd,dec_val);
              register_method_call(istate_00,uVar8);
              pcVar1 = colors->reset;
              pcVar2 = colors->num;
              sprintf(outs,"%s := %s0x%x%s [%s.%s], %s := %s%d%s, %s.%s := %s0x%x%s [%s]",mcr_mthd,
                      pcVar2,(ulong)istate_00->mthd,pcVar1,dec_obj,dec_mthd,mcr_incr,pcVar2,
                      (ulong)istate_00->incr,pcVar1,dec_obj,dec_mthd,pcVar2,(ulong)uVar8,pcVar1,
                      dec_val);
            }
            else {
              if (uVar5 != 0x70) {
                builtin_strncpy(outs,"???",4);
                return 0;
              }
              uVar5 = c * 4 & 0x3ffc;
              istate_00->mthd = uVar5;
              data = c >> 0xc & 0x3f;
              decode_method_raw(uVar5,data,obj,dec_obj,dec_mthd,dec_val);
              register_method_call(istate_00,data);
              pcVar4 = mcr_incr;
              pcVar3 = mcr_mthd;
              pcVar1 = colors->reset;
              pcVar2 = colors->num;
              uVar5 = istate_00->mthd;
              uVar6 = istate_00->incr;
              reg1_str(uVar8);
              sprintf(outs,
                      "%s := %s0x%x%s [%s.%s], %s := %s%d%s, %s.%s := %s0x%x%s [%s], %s := %s0x%x%s"
                      ,pcVar3,pcVar2,(ulong)uVar5,pcVar1,dec_obj,dec_mthd,pcVar4,pcVar2,(ulong)uVar6
                      ,pcVar1,dec_obj,dec_mthd,pcVar2,(ulong)data,pcVar1,dec_val,reg1_str::r,
                      colors->num,uVar9,colors->reset);
              *(uint32_t *)((long)istate_00->regs + (ulong)(uVar8 >> 6 & 0x1c)) = c;
            }
            goto LAB_0024f43e;
          }
          if (istate_00->macro_param == (uint32_t *)0x0) {
            return 1;
          }
          uVar5 = c * 4 & 0x3ffc;
          istate_00->mthd = uVar5;
          istate_00->incr = c >> 0xc & 0x3f;
          decode_method_raw(uVar5,*istate_00->macro_param,obj,dec_obj,dec_mthd,dec_val);
          register_method_call(istate_00,*istate_00->macro_param);
          reg1_str(uVar8);
          pcVar1 = colors->reset;
          pcVar2 = colors->num;
          sprintf(outs,
                  "%s := %s0x%x%s, %s := %s0x%x%s [%s.%s], %s := %s%d%s, %s.%s := %s0x%x%s [%s]",
                  reg1_str::r,pcVar2,uVar9,pcVar1,mcr_mthd,pcVar2,(ulong)istate_00->mthd,pcVar1,
                  dec_obj,dec_mthd,mcr_incr,pcVar2,(ulong)istate_00->incr,pcVar1,dec_obj,dec_mthd,
                  pcVar2,(ulong)*istate_00->macro_param,pcVar1,dec_val);
          istate_00->mthd = istate_00->mthd + istate_00->incr * 4;
          *(uint32_t *)((long)istate_00->regs + (ulong)(uVar8 >> 6 & 0x1c)) = c;
        }
      }
      goto LAB_0024f100;
    }
    if (istate_00->macro_param == (uint32_t *)0x0) {
      return 1;
    }
    decode_method_raw(istate_00->mthd,c,obj,dec_obj,dec_mthd,dec_val);
    register_method_call(istate_00,c);
    pcVar1 = colors->num;
    pcVar2 = colors->reset;
    uVar7 = (ulong)(uVar8 >> 8 & 7);
    sprintf(reg1_str::r,"%s$r%d%s",colors->reg,uVar7,pcVar2);
    sprintf(outs,"%s.%s := %s0x%x%s [%s], %s := %s0x%x%s",dec_obj,dec_mthd,pcVar1,uVar9,pcVar2,
            dec_val,reg1_str::r,colors->num,(ulong)*istate_00->macro_param,colors->reset);
    istate_00->mthd = istate_00->mthd + istate_00->incr * 4;
  }
  istate_00->regs[uVar7] = *istate_00->macro_param;
LAB_0024f100:
  istate_00->macro_param = (uint32_t *)0x0;
  return 0;
}

Assistant:

static int macro_sim_dst(char *out, uint32_t c, uint32_t res,
		struct macro_interpreter_state *istate)
{
	uint32_t *regs = istate->regs;
	uint32_t *mthd = &istate->mthd;
	uint32_t *incr = &istate->incr;
	struct obj *obj = istate->obj;

	if ((c & 0x00000070) == 0x00000000)
	{
		// { 0x00000000, 0x00000070, N("parm"), REG1, N("ign") }
		// ignore result, fetch param to REG1
		if (!istate->macro_param)
			return 1;
		sprintf(outs,
				"%s := %s0x%x%s", // $rX := 0x...
				reg1_str(c), colors->num, *istate->macro_param, colors->reset);

		regs[reg1(c)] = *istate->macro_param;
		istate->macro_param = NULL;
	}
	else if ((c & 0x00000070) == 0x00000010)
	{
		// { 0x00000010, 0x00000070, N("mov"), REG1 }
		// store result to REG1
		sprintf(out,
				"%s := %s0x%x%s", // $rX := 0x...
				reg1_str(c), colors->num, res, colors->reset);

		regs[reg1(c)] = res;
	}
	else if ((c & 0x00000770) == 0x00000020)
	{
		// { 0x00000020, 0x00000770, N("maddr") }
		decode_maddr(res, mthd, incr);

		decode_method_raw(*mthd, 0, obj, dec_obj, dec_mthd, NULL);
		sprintf(out,
				"%s := %s0x%x%s [%s.%s], " // mthd := 0x.... [NVXX_3D....]
				"%s := %s%d%s",            // incr := ...
				mcr_mthd, colors->num, *mthd, colors->reset, dec_obj, dec_mthd,
				mcr_incr, colors->num, *incr, colors->reset);
	}
	else if ((c & 0x00000070) == 0x00000020)
	{
		// { 0x00000020, 0x00000070, N("maddr"), REG1 }
		// use result as maddr and store it to REG1
		decode_maddr(res, mthd, incr);

		decode_method_raw(*mthd, 0, obj, dec_obj, dec_mthd, NULL);
		sprintf(out,
				"%s := %s := %s0x%x%s [%s.%s], " // $rX := mthd := 0x... [NVXX_3D....]
				"%s := %s%d%s",                  // incr := ...
				reg1_str(c), mcr_mthd, colors->num, *mthd, colors->reset, dec_obj, dec_mthd,
				mcr_incr, colors->num, *incr, colors->reset);

		regs[reg1(c)] = res;
	}
	else if ((c & 0x00000070) == 0x00000030)
	{
		// { 0x00000030, 0x00000070, N("parm"), REG1, N("send") }
		// send result, then fetch param to REG1
		if (!istate->macro_param)
			return 1;

		decode_method_raw(*mthd, res, obj, dec_obj, dec_mthd, dec_val);
		register_method_call(istate, res);

		sprintf(out,
				"%s.%s := %s0x%x%s [%s], " // NVXX_3D.... := 0x... [desc_val]
				"%s := %s0x%x%s",          // $rX := 0x...
				dec_obj, dec_mthd, colors->num, res, colors->reset, dec_val,
				reg1_str(c), colors->num, *istate->macro_param, colors->reset);

		*mthd += *incr * 4;
		regs[reg1(c)] = *istate->macro_param;
		istate->macro_param = NULL;
	}
	else if ((c & 0x00000770) == 0x00000040)
	{
		// { 0x00000040, 0x00000770, N("send") }
		decode_method_raw(*mthd, res, obj, dec_obj, dec_mthd, dec_val);
		register_method_call(istate, res);

		sprintf(out,
				"%s.%s := %s0x%x%s [%s]", // NVXX_3D.... := 0x... [desc_val]
				dec_obj, dec_mthd, colors->num, res, colors->reset, dec_val);

		*mthd += *incr * 4;
	}
	else if ((c & 0x00000070) == 0x00000040)
	{
		// { 0x00000040, 0x00000070, N("send"), REG1 }
		// send result and store it to REG1
		decode_method_raw(*mthd, res, obj, dec_obj, dec_mthd, dec_val);
		register_method_call(istate, res);

		sprintf(out,
				"%s.%s := %s0x%x%s [%s], " // NVXX_3D.... := 0x... [desc_val]
				"%s := %s0x%x%s",          // $rX := 0x...
				dec_obj, dec_mthd, colors->num, res, colors->reset, dec_val,
				reg1_str(c), colors->num, res, colors->reset);

		*mthd += *incr * 4;
		regs[reg1(c)] = res;
	}
	else if ((c & 0x00000070) == 0x00000050)
	{
		// { 0x00000050, 0x00000070, N("parm"), REG1, N("maddr") }
		// use result as maddr, then fetch param to REG1
		if (!istate->macro_param)
			return 1;

		decode_maddr(res, mthd, incr);

		decode_method_raw(*mthd, 0, obj, dec_obj, dec_mthd, NULL);

		sprintf(out,
				"%s := %s0x%x%s [%s.%s], " // mthd := 0x... [NVXX_3D....]
				"%s := %s%d%s, "           // incr := ...
				"%s := %s0x%x%s",          // $rX := 0x...
				mcr_mthd, colors->num, *mthd, colors->reset, dec_obj, dec_mthd,
				mcr_incr, colors->num, *incr, colors->reset,
				reg1_str(c), colors->num, *istate->macro_param, colors->reset);

		regs[reg1(c)] = *istate->macro_param;
		istate->macro_param = NULL;
	}
	else if ((c & 0x00000770) == 0x00000060)
	{
		// { 0x00000060, 0x00000770, N("parmsend"), N("maddr") }
		// use result as maddr, then fetch param and send it.
		if (!istate->macro_param)
			return 1;

		decode_maddr(res, mthd, incr);

		decode_method_raw(*mthd, *istate->macro_param, obj, dec_obj, dec_mthd, dec_val);
		register_method_call(istate, *istate->macro_param);

		sprintf(out,
				"%s := %s0x%x%s [%s.%s], " // mthd := 0x... [NVXX_3D....]
				"%s := %s%d%s, "           // incr := ...
				"%s.%s := %s0x%x%s [%s]",  // NVXX_3D.... := 0x... [desc_val]
				mcr_mthd, colors->num, *mthd, colors->reset, dec_obj, dec_mthd,
				mcr_incr, colors->num, *incr, colors->reset,
				dec_obj, dec_mthd, colors->num, *istate->macro_param, colors->reset, dec_val);

		*mthd += *incr * 4;
		istate->macro_param = NULL;
	}
	else if ((c & 0x00000070) == 0x00000060)
	{
		// { 0x00000060, 0x00000070, N("parmsend"), N("maddr"), REG1 }
		// use result as maddr and store it to REG1, then fetch param and send it.
		if (!istate->macro_param)
			return 1;

		decode_maddr(res, mthd, incr);

		decode_method_raw(*mthd, *istate->macro_param, obj, dec_obj, dec_mthd, dec_val);
		register_method_call(istate, *istate->macro_param);

		sprintf(out,
				"%s := %s0x%x%s, "         // rX := 0x...
				"%s := %s0x%x%s [%s.%s], " // mthd := 0x... [NVXX_3D....]
				"%s := %s%d%s, "           // incr := 0x...
				"%s.%s := %s0x%x%s [%s]",  // NVXX_3D.... := 0x... [desc_val]
				reg1_str(c), colors->num, res, colors->reset,
				mcr_mthd, colors->num, *mthd, colors->reset, dec_obj, dec_mthd,
				mcr_incr, colors->num, *incr, colors->reset,
				dec_obj, dec_mthd, colors->num, *istate->macro_param, colors->reset, dec_val);

		*mthd += *incr * 4;
		regs[reg1(c)] = res;
		istate->macro_param = NULL;
	}
	else if ((c & 0x00000770) == 0x00000070)
	{
		// { 0x00000070, 0x00000770, N("maddrsend") }
		// use result as maddr, then send bits 12-17 of result
		decode_maddr(res, mthd, NULL);

		uint32_t mthd_data = (res >> 12) & 0x3f;

		decode_method_raw(*mthd, mthd_data, obj, dec_obj, dec_mthd, dec_val);
		register_method_call(istate, mthd_data);

		sprintf(out,
				"%s := %s0x%x%s [%s.%s], " // mthd := 0x... [NVXX_3D....]
				"%s := %s%d%s, "           // incr := ...
				"%s.%s := %s0x%x%s [%s]",  // NVXX_3D.... := 0x... [desc_val]
				mcr_mthd, colors->num, *mthd, colors->reset, dec_obj, dec_mthd,
				mcr_incr, colors->num, *incr, colors->reset,
				dec_obj, dec_mthd, colors->num, mthd_data, colors->reset, dec_val);

		*mthd += *incr * 4;
	}
	else if ((c & 0x00000070) == 0x00000070)
	{
		// { 0x00000070, 0x00000070, N("maddrsend"), REG1 }
		// use result as maddr, then send bits 12-17 of result, then store result to REG1
		decode_maddr(res, mthd, NULL);

		uint32_t mthd_data = (res >> 12) & 0x3f;

		decode_method_raw(*mthd, mthd_data, obj, dec_obj, dec_mthd, dec_val);
		register_method_call(istate, mthd_data);

		sprintf(out,
				"%s := %s0x%x%s [%s.%s], " // mthd := 0x... [NVXX_3D....]
				"%s := %s%d%s, "           // incr := ...
				"%s.%s := %s0x%x%s [%s], " // NVXX_3D.... := 0x... [desc_val]
				"%s := %s0x%x%s",          // $rX := 0x...
				mcr_mthd, colors->num, *mthd, colors->reset, dec_obj, dec_mthd,
				mcr_incr, colors->num, *incr, colors->reset,
				dec_obj, dec_mthd, colors->num, mthd_data, colors->reset, dec_val,
				reg1_str(c), colors->num, res, colors->reset);

		regs[reg1(c)] = res;
		*mthd += *incr * 4;
	}
	else
		sprintf(out, "???");

	return 0;
}